

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int32 revert_bkp(int32 mixw_reest,int32 tmat_reest,int32 mean_reest,int32 var_reest,char *out_dir)

{
  int iVar1;
  char local_2048 [8];
  char fn_bkp [4097];
  char local_1038 [8];
  char fn [4097];
  char *out_dir_local;
  int32 var_reest_local;
  int32 mean_reest_local;
  int32 tmat_reest_local;
  int32 mixw_reest_local;
  
  if (mixw_reest != 0) {
    sprintf(local_1038,"%s/mixw_counts",out_dir);
    sprintf(local_2048,"%s/mixw_counts.bkp",out_dir);
    iVar1 = rename(local_2048,local_1038);
    if (iVar1 < 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                     ,0x2dd,"Couldn\'t revert to backup of %s\n",local_1038);
      return -1;
    }
  }
  if (tmat_reest != 0) {
    sprintf(local_1038,"%s/tmat_counts",out_dir);
    sprintf(local_2048,"%s/tmat_counts.bkp",out_dir);
    iVar1 = rename(local_2048,local_1038);
    if (iVar1 < 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                     ,0x2e7,"Couldn\'t revert to backup of %s\n",local_1038);
      return -1;
    }
  }
  if ((mean_reest != 0) || (var_reest != 0)) {
    sprintf(local_1038,"%s/gauden_counts",out_dir);
    sprintf(local_2048,"%s/gauden_counts.bkp",out_dir);
    iVar1 = rename(local_2048,local_1038);
    if (iVar1 < 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                     ,0x2f0,"Couldn\'t revert to backup of %s\n",local_1038);
      return -1;
    }
  }
  return 0;
}

Assistant:

static int32
revert_bkp(int32 mixw_reest,
	   int32 tmat_reest,
	   int32 mean_reest,
	   int32 var_reest,
	   const char *out_dir)
{
    char fn[MAXPATHLEN+1];
    char fn_bkp[MAXPATHLEN+1];

    if (mixw_reest) {
	sprintf(fn, "%s/mixw_counts", out_dir);
	sprintf(fn_bkp, "%s/mixw_counts.bkp", out_dir);

	if (rename(fn_bkp, fn) < 0) {
	    E_ERROR_SYSTEM("Couldn't revert to backup of %s\n", fn);
	    
	    return S3_ERROR;
	}
    }
    if (tmat_reest) {
	sprintf(fn, "%s/tmat_counts", out_dir);
	sprintf(fn_bkp, "%s/tmat_counts.bkp", out_dir);

	if (rename(fn_bkp, fn) < 0) {
	    E_ERROR_SYSTEM("Couldn't revert to backup of %s\n", fn);
	    return S3_ERROR;
	}
    }
    if (mean_reest || var_reest) {
	sprintf(fn, "%s/gauden_counts", out_dir);
	sprintf(fn_bkp, "%s/gauden_counts.bkp", out_dir);

	if (rename(fn_bkp, fn) < 0) {
	    E_ERROR_SYSTEM("Couldn't revert to backup of %s\n", fn);
	    return S3_ERROR;
	}
    }

    return S3_SUCCESS;
}